

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamAssignmentSyntax,slang::syntax::DefParamAssignmentSyntax_const&>
          (BumpAllocator *this,DefParamAssignmentSyntax *args)

{
  SyntaxNode *pSVar1;
  NameSyntax *pNVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  DefParamAssignmentSyntax *pDVar5;
  
  pDVar5 = (DefParamAssignmentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefParamAssignmentSyntax *)this->endPtr < pDVar5 + 1) {
    pDVar5 = (DefParamAssignmentSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pDVar5 + 1);
  }
  (pDVar5->setter).ptr = (args->setter).ptr;
  SVar3 = (args->super_SyntaxNode).kind;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pNVar2 = (args->name).ptr;
  (pDVar5->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  (pDVar5->name).ptr = pNVar2;
  (pDVar5->super_SyntaxNode).kind = SVar3;
  *(undefined4 *)&(pDVar5->super_SyntaxNode).field_0x4 = uVar4;
  (pDVar5->super_SyntaxNode).parent = pSVar1;
  return pDVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }